

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

void Amap_ManMap(Amap_Man_t *p)

{
  bool local_15;
  int local_14;
  int i;
  Amap_Man_t *p_local;
  
  Amap_ManMerge(p);
  for (local_14 = 0; local_14 < p->pPars->nIterFlow; local_14 = local_14 + 1) {
    Amap_ManMatch(p,1,(uint)(0 < local_14));
  }
  for (local_14 = 0; local_14 < p->pPars->nIterArea; local_14 = local_14 + 1) {
    local_15 = 0 < p->pPars->nIterFlow || 0 < local_14;
    Amap_ManMatch(p,0,(uint)local_15);
  }
  Amap_ManCleanData(p);
  return;
}

Assistant:

void Amap_ManMap( Amap_Man_t * p )
{
    int i;
    Amap_ManMerge( p );
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, i>0 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, p->pPars->nIterFlow>0||i>0 );
/*
    for ( i = 0; i < p->pPars->nIterFlow; i++ )
        Amap_ManMatch( p, 1, 1 );
    for ( i = 0; i < p->pPars->nIterArea; i++ )
        Amap_ManMatch( p, 0, 1 );
*/
    Amap_ManCleanData( p );
}